

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.cpp
# Opt level: O2

void InitEval1(void)

{
  int iVar1;
  array<int,_3UL> *paVar2;
  double (*padVar3) [3];
  int *piVar4;
  int u;
  long lVar5;
  int v;
  long lVar6;
  array<int,_3UL> *paVar7;
  short i;
  long lVar8;
  double dVar9;
  double dVar10;
  TBoard board;
  
  for (lVar8 = 0; lVar8 != 0x4ce3; lVar8 = lVar8 + 1) {
    makeBoard((short)lVar8);
    dVar9 = 0.0;
    if (g_board_status[lVar8] == '\0') {
      padVar3 = g_eval_micro_matrix1;
      paVar2 = board._M_elems;
      for (lVar5 = 0; lVar5 != 3; lVar5 = lVar5 + 1) {
        for (lVar6 = 0; lVar6 != 3; lVar6 = lVar6 + 1) {
          iVar1 = ((array<int,_3UL> *)paVar2->_M_elems)->_M_elems[lVar6];
          if (iVar1 != 0) {
            dVar9 = dVar9 + (double)(iVar1 * -2 + 3) * (*padVar3)[lVar6];
          }
        }
        padVar3 = padVar3 + 1;
        paVar2 = paVar2 + 1;
      }
      piVar4 = board._M_elems[0]._M_elems + 1;
      paVar2 = board._M_elems;
      for (lVar5 = 0; lVar5 != 3; lVar5 = lVar5 + 1) {
        paVar7 = paVar2;
        for (lVar6 = 0; lVar6 != 2; lVar6 = lVar6 + 1) {
          iVar1 = piVar4[lVar6 + -1];
          if ((iVar1 != 0) && (iVar1 == piVar4[lVar6])) {
            dVar10 = (double)(iVar1 * -2 + 3);
            dVar9 = dVar9 + dVar10 + dVar10;
          }
          iVar1 = paVar7->_M_elems[0];
          if ((iVar1 != 0) && (iVar1 == paVar7[1]._M_elems[0])) {
            dVar10 = (double)(iVar1 * -2 + 3);
            dVar9 = dVar9 + dVar10 + dVar10;
          }
          paVar7 = paVar7 + 1;
        }
        piVar4 = piVar4 + 3;
        paVar2 = (array<int,_3UL> *)(paVar2->_M_elems + 1);
      }
      if (board._M_elems[1]._M_elems[1] != 0) {
        if ((board._M_elems[1]._M_elems[1] == board._M_elems[0]._M_elems[0]) ||
           (board._M_elems[1]._M_elems[1] == board._M_elems[2]._M_elems[2])) {
          dVar10 = (double)(board._M_elems[1]._M_elems[1] * -2 + 3);
          dVar9 = dVar9 + dVar10 + dVar10;
        }
        if ((board._M_elems[1]._M_elems[1] == board._M_elems[2]._M_elems[0]) ||
           (board._M_elems[1]._M_elems[1] == board._M_elems[0]._M_elems[2])) {
          dVar10 = (double)(board._M_elems[1]._M_elems[1] * -2 + 3);
          dVar9 = dVar9 + dVar10 + dVar10;
        }
      }
    }
    g_eval_micro1[lVar8] = dVar9;
  }
  for (lVar8 = 0; lVar8 != 0x40000; lVar8 = lVar8 + 1) {
    makeBoard4((int)lVar8);
    dVar9 = 0.0;
    padVar3 = g_eval_macro_matrix1;
    paVar2 = board._M_elems;
    for (lVar5 = 0; lVar5 != 3; lVar5 = lVar5 + 1) {
      for (lVar6 = 0; lVar6 != 3; lVar6 = lVar6 + 1) {
        iVar1 = ((array<int,_3UL> *)paVar2->_M_elems)->_M_elems[lVar6];
        if (iVar1 - 1U < 2) {
          dVar9 = dVar9 + (double)(iVar1 * -2 + 3) * (*padVar3)[lVar6];
        }
      }
      padVar3 = padVar3 + 1;
      paVar2 = paVar2 + 1;
    }
    paVar2 = board._M_elems;
    piVar4 = board._M_elems[0]._M_elems + 1;
    for (lVar5 = 0; lVar5 != 3; lVar5 = lVar5 + 1) {
      paVar7 = paVar2;
      for (lVar6 = 0; lVar6 != 2; lVar6 = lVar6 + 1) {
        iVar1 = piVar4[lVar6 + -1];
        if ((iVar1 != 0) && (iVar1 == piVar4[lVar6])) {
          dVar9 = dVar9 + (double)(iVar1 * -2 + 3) * 15.0;
        }
        iVar1 = paVar7->_M_elems[0];
        if ((iVar1 != 0) && (iVar1 == paVar7[1]._M_elems[0])) {
          dVar9 = dVar9 + (double)(iVar1 * -2 + 3) * 15.0;
        }
        paVar7 = paVar7 + 1;
      }
      piVar4 = piVar4 + 3;
      paVar2 = (array<int,_3UL> *)(paVar2->_M_elems + 1);
    }
    if (board._M_elems[1]._M_elems[1] - 1U < 2) {
      if ((board._M_elems[1]._M_elems[1] == board._M_elems[0]._M_elems[0]) ||
         (board._M_elems[1]._M_elems[1] == board._M_elems[2]._M_elems[2])) {
        dVar9 = dVar9 + (double)(board._M_elems[1]._M_elems[1] * -2 + 3) * 15.0;
      }
      if ((board._M_elems[1]._M_elems[1] == board._M_elems[2]._M_elems[0]) ||
         (board._M_elems[1]._M_elems[1] == board._M_elems[0]._M_elems[2])) {
        dVar9 = dVar9 + (double)(board._M_elems[1]._M_elems[1] * -2 + 3) * 15.0;
      }
    }
    g_eval_macro1[lVar8] = dVar9;
  }
  return;
}

Assistant:

void
InitEval1()
{
    for (short i = 0; i < 19683; i++)
    {
        double points = 0.0;
        auto board = makeBoard(i);
        if (g_board_status[i] == 0)
        {
            for (int u = 0; u < 3; ++u)
                for (int v = 0; v < 3; ++v)
                    if (board[u][v] != 0)
                        points += (-2 * board[u][v] + 3) * g_eval_micro_matrix1[u][v];
            for (int u = 0; u < 3; ++u)
                for (int v = 0; v < 2; ++v)
                {
                    if (board[u][v] == board[u][v + 1] && board[u][v] != 0)
                        points += (-2 * board[u][v] + 3) * g_micro_double_bonus1;
                    if (board[v][u] == board[v + 1][u] && board[v][u] != 0)
                        points += (-2 * board[v][u] + 3) * g_micro_double_bonus1;
                }
            if (board[1][1] != 0)
            {
                if (board[1][1] == board[0][0] || board[1][1] == board[2][2])
                    points += (-2 * board[1][1] + 3) * g_micro_double_bonus1;
                if (board[1][1] == board[2][0] || board[1][1] == board[0][2])
                    points += (-2 * board[1][1] + 3) * g_micro_double_bonus1;
            }
        }
        g_eval_micro1[i] = points;
    }

    for (int i = 0; i < 262144; i++)
    {
        double points = 0.0;
        auto board = makeBoard4(i);
        for (int u = 0; u < 3; ++u)
            for (int v = 0; v < 3; ++v)
                if (board[u][v] == 1 || board[u][v] == 2)
                    points += (-2 * board[u][v] + 3) * g_eval_macro_matrix1[u][v];
        for (int u = 0; u < 3; ++u)
            for (int v = 0; v < 2; ++v)
            {
                if (board[u][v] == board[u][v + 1] && board[u][v] != 0)
                    points += (-2 * board[u][v] + 3) * g_macro_double_bonus1;
                if (board[v][u] == board[v + 1][u] && board[v][u] != 0)
                    points += (-2 * board[v][u] + 3) * g_macro_double_bonus1;
            }
        if (board[1][1] == 1 || board[1][1] == 2)
        {
            if (board[1][1] == board[0][0] || board[1][1] == board[2][2])
                points += (-2 * board[1][1] + 3) * g_macro_double_bonus1;
            if (board[1][1] == board[2][0] || board[1][1] == board[0][2])
                points += (-2 * board[1][1] + 3) * g_macro_double_bonus1;
        }
        g_eval_macro1[i] = points;
    }
}